

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O3

int32_t __thiscall
icu_63::CollationDataBuilder::addContextTrie
          (CollationDataBuilder *this,uint32_t defaultCE32,UCharsTrieBuilder *trieBuilder,
          UErrorCode *errorCode)

{
  undefined4 srcLength;
  int32_t length;
  UnicodeString *pUVar1;
  int32_t srcLength_00;
  int32_t iVar2;
  short sVar3;
  int32_t iVar4;
  int32_t len;
  UnicodeString context;
  UnicodeString trieString;
  UnicodeString local_a8;
  UnicodeString local_68;
  
  local_a8.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003bc258;
  local_a8.fUnion.fStackFields.fLengthAndFlags = 2;
  local_68.super_Replaceable.super_UObject._vptr_UObject._0_2_ = (short)(defaultCE32 >> 0x10);
  pUVar1 = UnicodeString::doAppend(&local_a8,(UChar *)&local_68,0,1);
  local_68.super_Replaceable.super_UObject._vptr_UObject._0_2_ = (short)defaultCE32;
  UnicodeString::doAppend(pUVar1,(UChar *)&local_68,0,1);
  local_68.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003bc258;
  local_68.fUnion.fStackFields.fLengthAndFlags = 2;
  pUVar1 = UCharsTrieBuilder::buildUnicodeString
                     (trieBuilder,USTRINGTRIE_BUILD_SMALL,&local_68,errorCode);
  sVar3 = (pUVar1->fUnion).fStackFields.fLengthAndFlags;
  if (sVar3 < 0) {
    iVar2 = (pUVar1->fUnion).fFields.fLength;
  }
  else {
    iVar2 = (int)sVar3 >> 5;
  }
  UnicodeString::doAppend(&local_a8,pUVar1,0,iVar2);
  iVar2 = -1;
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    srcLength_00 = (int)local_a8.fUnion.fStackFields.fLengthAndFlags >> 5;
    srcLength = srcLength_00;
    if (local_a8.fUnion.fStackFields.fLengthAndFlags < 0) {
      srcLength = local_a8.fUnion.fFields.fLength;
    }
    sVar3 = (this->contexts).fUnion.fStackFields.fLengthAndFlags;
    iVar2 = (int)sVar3 >> 5;
    iVar4 = (this->contexts).fUnion.fFields.fLength;
    length = iVar2;
    if (sVar3 < 0) {
      length = iVar4;
    }
    if (((((int)local_a8.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) && (-1 < (int)srcLength))
       && (srcLength != 0)) {
      if ((local_a8.fUnion.fStackFields.fLengthAndFlags & 2U) != 0) {
        local_a8.fUnion.fFields.fArray = local_a8.fUnion.fStackFields.fBuffer;
      }
      iVar2 = UnicodeString::indexOf
                        (&this->contexts,local_a8.fUnion.fFields.fArray,0,srcLength,0,length);
      if (-1 < iVar2) goto LAB_002322c7;
      sVar3 = (this->contexts).fUnion.fStackFields.fLengthAndFlags;
      iVar4 = (this->contexts).fUnion.fFields.fLength;
      iVar2 = (int)sVar3 >> 5;
      srcLength_00 = (int)local_a8.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
    if (sVar3 < 0) {
      iVar2 = iVar4;
    }
    if (local_a8.fUnion.fStackFields.fLengthAndFlags < 0) {
      srcLength_00 = local_a8.fUnion.fFields.fLength;
    }
    UnicodeString::doAppend(&this->contexts,&local_a8,0,srcLength_00);
  }
LAB_002322c7:
  UnicodeString::~UnicodeString(&local_68);
  UnicodeString::~UnicodeString(&local_a8);
  return iVar2;
}

Assistant:

int32_t
CollationDataBuilder::addContextTrie(uint32_t defaultCE32, UCharsTrieBuilder &trieBuilder,
                                     UErrorCode &errorCode) {
    UnicodeString context;
    context.append((UChar)(defaultCE32 >> 16)).append((UChar)defaultCE32);
    UnicodeString trieString;
    context.append(trieBuilder.buildUnicodeString(USTRINGTRIE_BUILD_SMALL, trieString, errorCode));
    if(U_FAILURE(errorCode)) { return -1; }
    int32_t index = contexts.indexOf(context);
    if(index < 0) {
        index = contexts.length();
        contexts.append(context);
    }
    return index;
}